

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O0

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::WriteDouble(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
              *this,double d)

{
  bool bVar1;
  Ch *buffer_00;
  char *pcVar2;
  char *end;
  char *buffer;
  double local_20;
  double d_local;
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  *this_local;
  
  local_20 = d;
  d_local = (double)this;
  internal::Double::Double((Double *)&buffer,d);
  bVar1 = internal::Double::IsNanOrInf((Double *)&buffer);
  if (bVar1) {
    PutReserve<rapidjson::UTF8<char>,rapidjson::CrtAllocator>(this->os_,3);
    PutUnsafe<rapidjson::UTF8<char>,rapidjson::CrtAllocator>(this->os_,'0');
    PutUnsafe<rapidjson::UTF8<char>,rapidjson::CrtAllocator>(this->os_,'.');
    PutUnsafe<rapidjson::UTF8<char>,rapidjson::CrtAllocator>(this->os_,'0');
  }
  else {
    buffer_00 = GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Push
                          (this->os_,0x19);
    pcVar2 = internal::dtoa(local_20,buffer_00,this->maxDecimalPlaces_);
    GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Pop
              (this->os_,0x19 - ((long)pcVar2 - (long)buffer_00));
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

inline bool Writer<StringBuffer>::WriteDouble(double d) {
    if (internal::Double(d).IsNanOrInf()) {
        // Note: This code path can only be reached if (RAPIDJSON_WRITE_DEFAULT_FLAGS & kWriteNanAndInfFlag).
		if (!(kWriteDefaultFlags & kWriteNanAndInfFlag))
		{
			// At least ensure that the output does not get broken.
			PutReserve(*os_, 3);
			PutUnsafe(*os_, '0');
			PutUnsafe(*os_, '.');
			PutUnsafe(*os_, '0');
			return false;
		}
        if (internal::Double(d).IsNan()) {
            PutReserve(*os_, 3);
            PutUnsafe(*os_, 'N'); PutUnsafe(*os_, 'a'); PutUnsafe(*os_, 'N');
            return true;
        }
        if (internal::Double(d).Sign()) {
            PutReserve(*os_, 9);
            PutUnsafe(*os_, '-');
        }
        else
            PutReserve(*os_, 8);
        PutUnsafe(*os_, 'I'); PutUnsafe(*os_, 'n'); PutUnsafe(*os_, 'f');
        PutUnsafe(*os_, 'i'); PutUnsafe(*os_, 'n'); PutUnsafe(*os_, 'i'); PutUnsafe(*os_, 't'); PutUnsafe(*os_, 'y');
        return true;
    }
    
    char *buffer = os_->Push(25);
    char* end = internal::dtoa(d, buffer, maxDecimalPlaces_);
    os_->Pop(static_cast<size_t>(25 - (end - buffer)));
    return true;
}